

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O1

void __thiscall gl4cts::DirectStateAccess::Queries::FunctionalTest::clean(FunctionalTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_qo != (GLuint *)0x0) {
    (**(code **)(lVar2 + 0x458))(4);
    if (this->m_qo != (GLuint *)0x0) {
      operator_delete__(this->m_qo);
    }
    this->m_qo = (GLuint *)0x0;
  }
  if (this->m_fbo != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_fbo);
    this->m_fbo = 0;
  }
  if (this->m_rbo != 0) {
    (**(code **)(lVar2 + 0x460))(1,&this->m_rbo);
    this->m_rbo = 0;
  }
  if (this->m_vao != 0) {
    (**(code **)(lVar2 + 0x490))(1,&this->m_vao);
    this->m_vao = 0;
  }
  if (this->m_bo_query != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_bo_query);
    this->m_bo_query = 0;
  }
  if (this->m_bo_xfb != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_bo_xfb);
    this->m_bo_xfb = 0;
  }
  if (this->m_po != 0) {
    (**(code **)(lVar2 + 0x1680))(0);
    (**(code **)(lVar2 + 0x448))(this->m_po);
    this->m_po = 0;
  }
  return;
}

Assistant:

void FunctionalTest::clean()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Releasing queries. */
	if (DE_NULL != m_qo)
	{
		gl.deleteQueries(s_targets_count, m_qo);

		delete[] m_qo;

		m_qo = DE_NULL;
	}

	/* Release framebuffer. */
	if (m_fbo)
	{
		gl.deleteFramebuffers(1, &m_fbo);

		m_fbo = 0;
	}

	/* Release renderbuffer. */
	if (m_rbo)
	{
		gl.deleteRenderbuffers(1, &m_rbo);

		m_rbo = 0;
	}

	/* Release vertex array object. */
	if (m_vao)
	{
		gl.deleteVertexArrays(1, &m_vao);

		m_vao = 0;
	}

	/* Release buffer object for storing queries' results. */
	if (m_bo_query)
	{
		gl.deleteBuffers(1, &m_bo_query);

		m_bo_query = 0;
	}

	/* Release transform feedback buffer. */
	if (m_bo_xfb)
	{
		gl.deleteBuffers(1, &m_bo_xfb);

		m_bo_xfb = 0;
	}

	/* Release GLSL program. */
	if (m_po)
	{
		gl.useProgram(0);

		gl.deleteProgram(m_po);

		m_po = 0;
	}
}